

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_concurrency.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ca88::
ARTConcurrencyTest_DISABLED_ParallelRandomInsertDeleteGetScanStressTest_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTConcurrencyTest_DISABLED_ParallelRandomInsertDeleteGetScanStressTest_Test
          (ARTConcurrencyTest_DISABLED_ParallelRandomInsertDeleteGetScanStressTest_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTConcurrencyTest_DISABLED_ParallelRandomInsertDeleteGetScanStressTest_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  ~ARTConcurrencyTest_DISABLED_ParallelRandomInsertDeleteGetScanStressTest_Test(this);
  operator_delete(this,0x110);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTConcurrencyTest,
                 DISABLED_ParallelRandomInsertDeleteGetScanStressTest) {
  constexpr auto thread_count = 48;
  constexpr auto initial_keys = 152;
  constexpr auto ops_per_thread = 10'000'000;

  this->verifier.insert_key_range(0, initial_keys, true);
  this->template parallel_test<thread_count, ops_per_thread>(
      TestFixture::random_op_thread);
}